

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void place_stairs(chunk_conflict *c,loc grid,_Bool quest,wchar_t feat)

{
  wchar_t feat_local;
  _Bool quest_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  if (c->depth == 0) {
    square_set_feat((chunk *)c,(loc_conflict)grid,L'\x06');
  }
  else if ((quest) || ((int)(z_info->max_depth - 1) <= c->depth)) {
    square_set_feat((chunk *)c,(loc_conflict)grid,L'\x05');
  }
  else {
    square_set_feat((chunk *)c,(loc_conflict)grid,feat);
  }
  return;
}

Assistant:

static void place_stairs(struct chunk *c, struct loc grid, bool quest, int feat)
{
	if (!c->depth) {
		square_set_feat(c, grid, FEAT_MORE);
	} else if (quest || c->depth >= z_info->max_depth - 1) {
		square_set_feat(c, grid, FEAT_LESS);
	} else {
		square_set_feat(c, grid, feat);
	}
}